

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
 __thiscall
spvtools::opt::analysis::TypeManager::GetTypeAndPointerType
          (TypeManager *this,uint32_t id,StorageClass sc)

{
  tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  extraout_RDX;
  __uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
  extraout_RDX_00;
  __uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  _Var1;
  undefined4 in_register_00000034;
  pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
  pVar2;
  Type *type;
  StorageClass local_2c;
  Type *local_28;
  IRContext *local_20;
  
  local_28 = GetType((TypeManager *)CONCAT44(in_register_00000034,id),sc);
  if (local_28 == (Type *)0x0) {
    local_28 = (Type *)0x0;
    local_20 = (IRContext *)0x0;
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
         (tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
          )(tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
            )extraout_RDX.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  }
  else {
    MakeUnique<spvtools::opt::analysis::Pointer,spvtools::opt::analysis::Type*&,spv::StorageClass&>
              ((spvtools *)&local_20,&local_28,&local_2c);
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
         (tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
          )(tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
            )extraout_RDX_00.
             super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  }
  this->consumer_ = (MessageConsumer *)local_28;
  this->context_ = local_20;
  pVar2.second._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  pVar2.first = (Type *)this;
  return pVar2;
}

Assistant:

std::pair<Type*, std::unique_ptr<Pointer>> TypeManager::GetTypeAndPointerType(
    uint32_t id, spv::StorageClass sc) const {
  Type* type = GetType(id);
  if (type) {
    return std::make_pair(type, MakeUnique<Pointer>(type, sc));
  } else {
    return std::make_pair(type, std::unique_ptr<Pointer>());
  }
}